

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<float>::ParseHex(char *s,char *end,Uint *out_bits)

{
  bool bVar1;
  Result result;
  Uint UVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  int shift;
  int shift_1;
  anon_class_16_2_81164835 update_seen_trailing_non_zero;
  int significand_bits;
  uint32_t digit_1;
  int significand_exponent_add;
  bool exponent_is_neg;
  int exponent;
  int local_34;
  uint32_t digit;
  int significand_exponent;
  Uint significand;
  bool seen_trailing_non_zero;
  bool seen_dot;
  bool is_neg;
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  
  significand_exponent._3_1_ = 0;
  if (*s == '-') {
    significand_exponent._3_1_ = 1;
    end_local = s + 1;
  }
  else {
    end_local = s;
    if (*s == '+') {
      end_local = s + 1;
    }
  }
  _significand = out_bits;
  out_bits_local = (Uint *)end;
  bVar1 = StringStartsWith(end_local,end,"0x");
  if (!bVar1) {
    __assert_fail("StringStartsWith(s, end, \"0x\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                  ,0x107,
                  "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                 );
  }
  significand_exponent._2_1_ = 0;
  significand_exponent._1_1_ = 0;
  digit = 0;
  local_34 = 0;
  for (end_local = end_local + 2; end_local < out_bits_local; end_local = end_local + 1) {
    if (*end_local != '_') {
      if (*end_local == '.') {
        significand_exponent._2_1_ = 1;
      }
      else {
        result = ParseHexdigit(*end_local,(uint32_t *)&exponent);
        bVar1 = Succeeded(result);
        if (!bVar1) break;
        iVar3 = Clz(digit);
        if (0x20 - iVar3 < 0x19) {
          digit = digit * 0x10 + exponent;
          if ((significand_exponent._2_1_ & 1) != 0) {
            local_34 = local_34 + -4;
          }
        }
        else {
          if (((significand_exponent._1_1_ & 1) == 0) && (exponent != 0)) {
            significand_exponent._1_1_ = 1;
          }
          if ((significand_exponent._2_1_ & 1) == 0) {
            local_34 = local_34 + 4;
          }
        }
      }
    }
  }
  if (digit == 0) {
    UVar2 = Make((bool)(significand_exponent._3_1_ & 1),-0x7f,0);
    *_significand = UVar2;
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  else {
    significand_exponent_add = 0;
    bVar1 = false;
    if (end_local < out_bits_local) {
      bVar5 = true;
      if (*end_local != 'p') {
        bVar5 = *end_local == 'P';
      }
      if (!bVar5) {
        __assert_fail("*s == \'p\' || *s == \'P\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                      ,0x137,
                      "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                     );
      }
      pcVar4 = end_local + 1;
      significand_bits = 0;
      if (*pcVar4 == '-') {
        bVar1 = true;
        significand_bits = -local_34;
        pcVar4 = end_local + 2;
      }
      else if (*pcVar4 == '+') {
        significand_bits = local_34;
        pcVar4 = end_local + 2;
      }
      while (end_local = pcVar4, end_local < out_bits_local) {
        if (*end_local != '_') {
          update_seen_trailing_non_zero.significand._4_4_ = (int)*end_local - 0x30;
          if (9 < update_seen_trailing_non_zero.significand._4_4_) {
            __assert_fail("digit <= 9",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/literal.cc"
                          ,0x14c,
                          "static Result wabt::(anonymous namespace)::FloatParser<float>::ParseHex(const char *, const char *, Uint *) [T = float]"
                         );
          }
          significand_exponent_add =
               significand_exponent_add * 10 + update_seen_trailing_non_zero.significand._4_4_;
          if (0x7f < significand_exponent_add + significand_bits) break;
        }
        pcVar4 = end_local + 1;
      }
    }
    if (bVar1) {
      significand_exponent_add = -significand_exponent_add;
    }
    iVar3 = Clz(digit);
    iVar3 = -iVar3;
    update_seen_trailing_non_zero.significand._0_4_ = iVar3 + 0x20;
    significand_exponent_add =
         local_34 + (int)update_seen_trailing_non_zero.significand + -1 + significand_exponent_add;
    if (significand_exponent_add < -0x7e) {
      _shift = (bool *)((long)&significand_exponent + 1);
      update_seen_trailing_non_zero.seen_trailing_non_zero = (bool *)&digit;
      if ((int)update_seen_trailing_non_zero.significand < 0x18) {
        if ((int)update_seen_trailing_non_zero.significand < 0x17) {
          digit = digit << (0x17U - (char)(int)update_seen_trailing_non_zero.significand & 0x1f);
        }
      }
      else {
        ParseHex::anon_class_16_2_81164835::operator()((anon_class_16_2_81164835 *)&shift,iVar3 + 9)
        ;
        digit = digit >> ((byte)(iVar3 + 9) & 0x1f);
      }
      iVar3 = -0x7f - significand_exponent_add;
      if (iVar3 < 0x18) {
        if (iVar3 != 0) {
          ParseHex::anon_class_16_2_81164835::operator()((anon_class_16_2_81164835 *)&shift,iVar3);
          UVar2 = ShiftAndRoundToNearest(digit,iVar3,(bool)(significand_exponent._1_1_ & 1));
          digit = UVar2 & 0x7fffff;
        }
        if (digit != 0) {
          UVar2 = Make((bool)(significand_exponent._3_1_ & 1),-0x7f,digit);
          *_significand = UVar2;
          Result::Result((Result *)((long)&s_local + 4),Ok);
          return (Result)s_local._4_4_;
        }
      }
      UVar2 = Make((bool)(significand_exponent._3_1_ & 1),-0x7f,0);
      *_significand = UVar2;
    }
    else {
      if ((int)update_seen_trailing_non_zero.significand < 0x19) {
        if ((int)update_seen_trailing_non_zero.significand < 0x18) {
          digit = digit << (0x18U - (char)(int)update_seen_trailing_non_zero.significand & 0x1f);
        }
      }
      else {
        digit = ShiftAndRoundToNearest(digit,iVar3 + 8,(bool)(significand_exponent._1_1_ & 1));
        if (0xffffff < digit) {
          significand_exponent_add = significand_exponent_add + 1;
        }
      }
      if (0x7f < significand_exponent_add) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      UVar2 = Make((bool)(significand_exponent._3_1_ & 1),significand_exponent_add,digit & 0x7fffff)
      ;
      *_significand = UVar2;
    }
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result FloatParser<T>::ParseHex(const char* s,
                                const char* end,
                                Uint* out_bits) {
  bool is_neg = false;
  if (*s == '-') {
    is_neg = true;
    s++;
  } else if (*s == '+') {
    s++;
  }
  assert(StringStartsWith(s, end, "0x"));
  s += 2;

  // Loop over the significand; everything up to the 'p'.
  // This code is a bit nasty because we want to support extra zeroes anywhere
  // without having to use many significand bits.
  // e.g.
  // 0x00000001.0p0 => significand = 1, significand_exponent = 0
  // 0x10000000.0p0 => significand = 1, significand_exponent = 28
  // 0x0.000001p0 => significand = 1, significand_exponent = -24
  bool seen_dot = false;
  bool seen_trailing_non_zero = false;
  Uint significand = 0;
  int significand_exponent = 0;  // Exponent adjustment due to dot placement.
  for (; s < end; ++s) {
    uint32_t digit;
    if (*s == '_') {
      continue;
    } else if (*s == '.') {
      seen_dot = true;
    } else if (Succeeded(ParseHexdigit(*s, &digit))) {
      if (Traits::kBits - Clz(significand) <= Traits::kSigPlusOneBits) {
        significand = (significand << 4) + digit;
        if (seen_dot) {
          significand_exponent -= 4;
        }
      } else {
        if (!seen_trailing_non_zero && digit != 0) {
          seen_trailing_non_zero = true;
        }
        if (!seen_dot) {
          significand_exponent += 4;
        }
      }
    } else {
      break;
    }
  }

  if (significand == 0) {
    // 0 or -0.
    *out_bits = Make(is_neg, Traits::kMinExp, 0);
    return Result::Ok;
  }

  int exponent = 0;
  bool exponent_is_neg = false;
  if (s < end) {
    assert(*s == 'p' || *s == 'P');
    s++;
    // Exponent is always positive, but significand_exponent is signed.
    // significand_exponent_add is negated if exponent will be negative, so it
    // can be easily summed to see if the exponent is too large (see below).
    int significand_exponent_add = 0;
    if (*s == '-') {
      exponent_is_neg = true;
      significand_exponent_add = -significand_exponent;
      s++;
    } else if (*s == '+') {
      s++;
      significand_exponent_add = significand_exponent;
    }

    for (; s < end; ++s) {
      if (*s == '_') {
        continue;
      }

      uint32_t digit = (*s - '0');
      assert(digit <= 9);
      exponent = exponent * 10 + digit;
      if (exponent + significand_exponent_add >= Traits::kMaxExp) {
        break;
      }
    }
  }

  if (exponent_is_neg) {
    exponent = -exponent;
  }

  int significand_bits = Traits::kBits - Clz(significand);
  // -1 for the implicit 1 bit of the significand.
  exponent += significand_exponent + significand_bits - 1;

  if (exponent <= Traits::kMinExp) {
    // Maybe subnormal.
    auto update_seen_trailing_non_zero = [&](int shift) {
      assert(shift > 0);
      auto mask = (Uint(1) << (shift - 1)) - 1;
      seen_trailing_non_zero |= (significand & mask) != 0;
    };

    // Normalize significand.
    if (significand_bits > Traits::kSigBits) {
      int shift = significand_bits - Traits::kSigBits;
      update_seen_trailing_non_zero(shift);
      significand >>= shift;
    } else if (significand_bits < Traits::kSigBits) {
      significand <<= (Traits::kSigBits - significand_bits);
    }

    int shift = Traits::kMinExp - exponent;
    if (shift <= Traits::kSigBits) {
      if (shift) {
        update_seen_trailing_non_zero(shift);
        significand =
            ShiftAndRoundToNearest(significand, shift, seen_trailing_non_zero) &
            Traits::kSigMask;
      }
      exponent = Traits::kMinExp;

      if (significand != 0) {
        *out_bits = Make(is_neg, exponent, significand);
        return Result::Ok;
      }
    }

    // Not subnormal, too small; return 0 or -0.
    *out_bits = Make(is_neg, Traits::kMinExp, 0);
  } else {
    // Maybe Normal value.
    if (significand_bits > Traits::kSigPlusOneBits) {
      significand = ShiftAndRoundToNearest(
          significand, significand_bits - Traits::kSigPlusOneBits,
          seen_trailing_non_zero);
      if (significand > Traits::kSigPlusOneMask) {
        exponent++;
      }
    } else if (significand_bits < Traits::kSigPlusOneBits) {
      significand <<= (Traits::kSigPlusOneBits - significand_bits);
    }

    if (exponent >= Traits::kMaxExp) {
      // Would be inf or -inf, but the spec doesn't allow rounding hex-floats to
      // infinity.
      return Result::Error;
    }

    *out_bits = Make(is_neg, exponent, significand & Traits::kSigMask);
  }

  return Result::Ok;
}